

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

string * __thiscall
CLI::detail::generate_set<std::vector<char_const*,std::allocator<char_const*>>>
          (string *__return_storage_ptr__,detail *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *set)

{
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  ::std::__cxx11::string::string(local_50,",",&local_51);
  join<std::vector<char_const*,std::allocator<char_const*>>,CLI::detail::generate_set<std::vector<char_const*,std::allocator<char_const*>>>(std::vector<char_const*,std::allocator<char_const*>>const&)::_lambda(char_const*const&)_1_,void>
            (local_30,this,local_50);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}